

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsImport.cpp
# Opt level: O0

int __thiscall gdscpp::calculate_STR_bounding_box(gdscpp *this,int structure_index,int *destination)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  reference pgVar9;
  reference pgVar10;
  pointer pgVar11;
  reference piVar12;
  iterator __first;
  iterator __last;
  pointer pgVar13;
  pointer pgVar14;
  mapped_type *pmVar15;
  ostream *poVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  POINT *local_520;
  int local_448;
  int local_444;
  int y_max;
  int x_max;
  int y_min;
  int x_min;
  double row_spacing;
  double column_spacing;
  int referred_structure_height;
  int referred_structure_width;
  int aref_angle;
  POINT enclosed_array [4];
  POINT true_max;
  POINT corCol;
  POINT corRow;
  POINT cor;
  int a_referred_bound_box [4];
  iterator iStack_380;
  int target_structure_index_1;
  __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_> local_378;
  iterator AREF_iter;
  double temp_holder2;
  double temp_holder;
  double y_2_new;
  double x_2_new;
  double y_1_new;
  double x_1_new;
  double dStack_330;
  int angle;
  double y_2;
  double x_2;
  double y_1;
  double x_1;
  int placeholder;
  int referred_bound_box [4];
  iterator iStack_2f0;
  int target_structure_index;
  __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_> local_2e8;
  iterator SREF_iter;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2c8;
  int *local_2c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2b0;
  int *local_2a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_298;
  int *local_290;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_288;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_280;
  int local_278;
  int local_274;
  int local_bbox [4];
  iterator iStack_260;
  int offset;
  __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_> local_258;
  iterator path_iter;
  gdsBOX local_248;
  gdsBOX local_1e0;
  int local_178;
  int local_174;
  int BOX_bound_box [4];
  __normal_iterator<gdsBOX_*,_std::vector<gdsBOX,_std::allocator<gdsBOX>_>_> local_160;
  __normal_iterator<gdsBOX_*,_std::vector<gdsBOX,_std::allocator<gdsBOX>_>_> local_158;
  iterator box_iter;
  gdsBOUNDARY local_148;
  gdsBOUNDARY local_d0;
  int local_68;
  int local_64;
  int STR_bound_box [4];
  __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_> local_50
  ;
  __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_> local_48
  ;
  iterator boundary_iterator;
  int local_38;
  int iStack_34;
  bool box_initialized;
  int bound_box [4];
  int *destination_local;
  int structure_index_local;
  gdscpp *this_local;
  
  boundary_iterator._M_current._7_1_ = 0;
  pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                     (&this->STR,(long)structure_index);
  local_48._M_current =
       (gdsBOUNDARY *)
       std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::begin(&pvVar8->BOUNDARY);
  while( true ) {
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                       (&this->STR,(long)structure_index);
    local_50._M_current =
         (gdsBOUNDARY *)
         std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::end(&pvVar8->BOUNDARY);
    bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar2) break;
    if ((boundary_iterator._M_current._7_1_ & 1) == 0) {
      pgVar9 = __gnu_cxx::
               __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_>
               ::operator*(&local_48);
      gdsBOUNDARY::gdsBOUNDARY(&local_d0,pgVar9);
      fetch_boundary_bounding_box(this,&local_d0,&local_38);
      gdsBOUNDARY::~gdsBOUNDARY(&local_d0);
      boundary_iterator._M_current._7_1_ = 1;
    }
    else {
      pgVar9 = __gnu_cxx::
               __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_>
               ::operator*(&local_48);
      gdsBOUNDARY::gdsBOUNDARY(&local_148,pgVar9);
      fetch_boundary_bounding_box(this,&local_148,&local_68);
      gdsBOUNDARY::~gdsBOUNDARY(&local_148);
      if (local_68 < local_38) {
        local_38 = local_68;
      }
      if (local_64 < iStack_34) {
        iStack_34 = local_64;
      }
      if (bound_box[0] < STR_bound_box[0]) {
        bound_box[0] = STR_bound_box[0];
      }
      if (bound_box[1] < STR_bound_box[1]) {
        bound_box[1] = STR_bound_box[1];
      }
    }
    box_iter._M_current =
         (gdsBOX *)
         __gnu_cxx::
         __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_>::
         operator++(&local_48,0);
  }
  pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                     (&this->STR,(long)structure_index);
  local_158._M_current = (gdsBOX *)std::vector<gdsBOX,_std::allocator<gdsBOX>_>::begin(&pvVar8->BOX)
  ;
  while( true ) {
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                       (&this->STR,(long)structure_index);
    local_160._M_current = (gdsBOX *)std::vector<gdsBOX,_std::allocator<gdsBOX>_>::end(&pvVar8->BOX)
    ;
    bVar2 = __gnu_cxx::operator!=(&local_158,&local_160);
    if (!bVar2) break;
    if ((boundary_iterator._M_current._7_1_ & 1) == 0) {
      pgVar10 = __gnu_cxx::
                __normal_iterator<gdsBOX_*,_std::vector<gdsBOX,_std::allocator<gdsBOX>_>_>::
                operator*(&local_158);
      gdsBOX::gdsBOX(&local_1e0,pgVar10);
      fetch_box_bounding_box(this,&local_1e0,&local_38);
      gdsBOX::~gdsBOX(&local_1e0);
      boundary_iterator._M_current._7_1_ = 1;
    }
    else {
      pgVar10 = __gnu_cxx::
                __normal_iterator<gdsBOX_*,_std::vector<gdsBOX,_std::allocator<gdsBOX>_>_>::
                operator*(&local_158);
      gdsBOX::gdsBOX(&local_248,pgVar10);
      fetch_box_bounding_box(this,&local_248,&local_178);
      gdsBOX::~gdsBOX(&local_248);
      if (local_178 < local_38) {
        local_38 = local_178;
      }
      if (local_174 < iStack_34) {
        iStack_34 = local_174;
      }
      if (bound_box[0] < BOX_bound_box[0]) {
        bound_box[0] = BOX_bound_box[0];
      }
      if (bound_box[1] < BOX_bound_box[1]) {
        bound_box[1] = BOX_bound_box[1];
      }
    }
    path_iter._M_current =
         (gdsPATH *)
         __gnu_cxx::__normal_iterator<gdsBOX_*,_std::vector<gdsBOX,_std::allocator<gdsBOX>_>_>::
         operator++(&local_158,0);
  }
  pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                     (&this->STR,(long)structure_index);
  local_258._M_current =
       (gdsPATH *)std::vector<gdsPATH,_std::allocator<gdsPATH>_>::begin(&pvVar8->PATH);
  while( true ) {
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                       (&this->STR,(long)structure_index);
    iStack_260 = std::vector<gdsPATH,_std::allocator<gdsPATH>_>::end(&pvVar8->PATH);
    bVar2 = __gnu_cxx::operator!=(&local_258,&stack0xfffffffffffffda0);
    if (!bVar2) break;
    pgVar11 = __gnu_cxx::
              __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
              operator->(&local_258);
    dVar18 = round((double)pgVar11->width * 0.5);
    local_bbox[3] = (int)dVar18;
    pgVar11 = __gnu_cxx::
              __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
              operator->(&local_258);
    local_288._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&pgVar11->xCor);
    pgVar11 = __gnu_cxx::
              __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
              operator->(&local_258);
    local_290 = (int *)std::vector<int,_std::allocator<int>_>::end(&pgVar11->xCor);
    local_280 = std::
                min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          (local_288,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           local_290);
    piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&local_280);
    local_278 = *piVar12 - local_bbox[3];
    pgVar11 = __gnu_cxx::
              __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
              operator->(&local_258);
    local_2a0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&pgVar11->yCor);
    pgVar11 = __gnu_cxx::
              __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
              operator->(&local_258);
    local_2a8 = (int *)std::vector<int,_std::allocator<int>_>::end(&pgVar11->yCor);
    local_298 = std::
                min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          (local_2a0,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           local_2a8);
    piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&local_298);
    local_274 = *piVar12 - local_bbox[3];
    pgVar11 = __gnu_cxx::
              __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
              operator->(&local_258);
    local_2b8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&pgVar11->xCor);
    pgVar11 = __gnu_cxx::
              __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
              operator->(&local_258);
    local_2c0 = (int *)std::vector<int,_std::allocator<int>_>::end(&pgVar11->xCor);
    local_2b0 = std::
                max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          (local_2b8,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           local_2c0);
    piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&local_2b0);
    local_bbox[0] = *piVar12 + local_bbox[3];
    pgVar11 = __gnu_cxx::
              __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
              operator->(&local_258);
    __first = std::vector<int,_std::allocator<int>_>::begin(&pgVar11->yCor);
    pgVar11 = __gnu_cxx::
              __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
              operator->(&local_258);
    __last = std::vector<int,_std::allocator<int>_>::end(&pgVar11->yCor);
    local_2c8 = std::
                max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          (__first._M_current,__last._M_current);
    piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&local_2c8);
    local_bbox[1] = *piVar12 + local_bbox[3];
    if ((boundary_iterator._M_current._7_1_ & 1) == 0) {
      local_38 = local_278;
      iStack_34 = local_274;
      bound_box[0] = local_bbox[0];
      boundary_iterator._M_current._7_1_ = 1;
      bound_box[1] = local_bbox[1];
    }
    if (local_278 < local_38) {
      local_38 = local_278;
    }
    if (bound_box[0] < local_bbox[0]) {
      bound_box[0] = local_bbox[0];
    }
    if (local_274 < iStack_34) {
      iStack_34 = local_274;
    }
    if (bound_box[1] < local_bbox[1]) {
      bound_box[1] = local_bbox[1];
    }
    SREF_iter._M_current =
         (gdsSREF *)
         __gnu_cxx::__normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
         operator++(&local_258,0);
  }
  pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                     (&this->STR,(long)structure_index);
  local_2e8._M_current =
       (gdsSREF *)std::vector<gdsSREF,_std::allocator<gdsSREF>_>::begin(&pvVar8->SREF);
  while( true ) {
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                       (&this->STR,(long)structure_index);
    iStack_2f0 = std::vector<gdsSREF,_std::allocator<gdsSREF>_>::end(&pvVar8->SREF);
    bVar2 = __gnu_cxx::operator!=(&local_2e8,&stack0xfffffffffffffd10);
    if (!bVar2) break;
    pgVar13 = __gnu_cxx::
              __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
              operator->(&local_2e8);
    pmVar15 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[](&this->STR_Lookup,&pgVar13->name);
    iVar3 = *pmVar15;
    if (iVar3 == 1000000000) {
      poVar16 = std::operator<<((ostream *)&std::cout,"Error: reference to structure with no name.")
      ;
      std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
      poVar16 = std::operator<<((ostream *)&std::cout,"Terminating SREF bounding box check.");
      std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
      break;
    }
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)iVar3);
    iVar4 = pvVar8->bounding_box[0];
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)iVar3);
    iVar5 = pvVar8->bounding_box[1];
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)iVar3);
    iVar6 = pvVar8->bounding_box[2];
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)iVar3);
    referred_bound_box[1] = pvVar8->bounding_box[3];
    if (((iVar4 == 0) && (iVar5 == 0)) && ((iVar6 == 0 && (referred_bound_box[1] == 0)))) {
      poVar16 = std::operator<<((ostream *)&std::cout,
                                "Warning: Inaccuracy due to structures not being initialized.");
      std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
    }
    pgVar13 = __gnu_cxx::
              __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
              operator->(&local_2e8);
    placeholder = iVar5;
    if ((pgVar13->reflection & 1U) == 1) {
      placeholder = -referred_bound_box[1];
      referred_bound_box[1] = -iVar5;
    }
    y_1 = (double)iVar4;
    x_2 = (double)placeholder;
    y_2 = (double)iVar6;
    dStack_330 = (double)referred_bound_box[1];
    pgVar13 = __gnu_cxx::
              __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
              operator->(&local_2e8);
    if ((pgVar13->scale != 1.0) || (NAN(pgVar13->scale))) {
      pgVar13 = __gnu_cxx::
                __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
                operator->(&local_2e8);
      y_1 = y_1 * pgVar13->scale;
      pgVar13 = __gnu_cxx::
                __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
                operator->(&local_2e8);
      y_2 = y_2 * pgVar13->scale;
      pgVar13 = __gnu_cxx::
                __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
                operator->(&local_2e8);
      x_2 = x_2 * pgVar13->scale;
      pgVar13 = __gnu_cxx::
                __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
                operator->(&local_2e8);
      dStack_330 = dStack_330 * pgVar13->scale;
    }
    pgVar13 = __gnu_cxx::
              __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
              operator->(&local_2e8);
    x_1_new._4_4_ = (int)pgVar13->angle;
    if (0 < x_1_new._4_4_) {
      for (; 0x167 < x_1_new._4_4_; x_1_new._4_4_ = x_1_new._4_4_ + -0x168) {
      }
      dVar18 = cos(((double)x_1_new._4_4_ * 3.141592653589) / 180.0);
      dVar19 = sin(((double)x_1_new._4_4_ * 3.141592653589) / 180.0);
      dVar18 = y_1 * dVar18 + -(x_2 * dVar19);
      dVar19 = sin(((double)x_1_new._4_4_ * 3.141592653589) / 180.0);
      dVar20 = cos(((double)x_1_new._4_4_ * 3.141592653589) / 180.0);
      x_2 = y_1 * dVar19 + x_2 * dVar20;
      dVar19 = cos(((double)x_1_new._4_4_ * 3.141592653589) / 180.0);
      dVar20 = sin(((double)x_1_new._4_4_ * 3.141592653589) / 180.0);
      dVar19 = y_2 * dVar19 + -(dStack_330 * dVar20);
      dVar20 = sin(((double)x_1_new._4_4_ * 3.141592653589) / 180.0);
      dVar17 = cos(((double)x_1_new._4_4_ * 3.141592653589) / 180.0);
      dVar20 = y_2 * dVar20 + dStack_330 * dVar17;
      y_2 = dVar19;
      y_1 = dVar18;
      if (dVar19 < dVar18) {
        y_2 = dVar18;
        y_1 = dVar19;
      }
      dStack_330 = dVar20;
      if (dVar20 < x_2) {
        dStack_330 = x_2;
        x_2 = dVar20;
      }
    }
    dVar18 = round(y_1);
    pgVar13 = __gnu_cxx::
              __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
              operator->(&local_2e8);
    iVar3 = (int)dVar18 + pgVar13->xCor;
    dVar18 = round(x_2);
    pgVar13 = __gnu_cxx::
              __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
              operator->(&local_2e8);
    iVar4 = (int)dVar18 + pgVar13->yCor;
    dVar18 = round(y_2);
    pgVar13 = __gnu_cxx::
              __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
              operator->(&local_2e8);
    iVar5 = (int)dVar18 + pgVar13->xCor;
    dVar18 = round(dStack_330);
    pgVar13 = __gnu_cxx::
              __normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
              operator->(&local_2e8);
    iVar6 = (int)dVar18 + pgVar13->yCor;
    if ((boundary_iterator._M_current._7_1_ & 1) == 0) {
      boundary_iterator._M_current._7_1_ = 1;
      local_38 = iVar3;
      iStack_34 = iVar4;
      bound_box[0] = iVar5;
      bound_box[1] = iVar6;
    }
    if (iVar3 < local_38) {
      local_38 = iVar3;
    }
    if (bound_box[0] < iVar5) {
      bound_box[0] = iVar5;
    }
    if (iVar4 < iStack_34) {
      iStack_34 = iVar4;
    }
    if (bound_box[1] < iVar6) {
      bound_box[1] = iVar6;
    }
    AREF_iter._M_current =
         (gdsAREF *)
         __gnu_cxx::__normal_iterator<gdsSREF_*,_std::vector<gdsSREF,_std::allocator<gdsSREF>_>_>::
         operator++(&local_2e8,0);
  }
  pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                     (&this->STR,(long)structure_index);
  local_378._M_current =
       (gdsAREF *)std::vector<gdsAREF,_std::allocator<gdsAREF>_>::begin(&pvVar8->AREF);
  do {
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[]
                       (&this->STR,(long)structure_index);
    iStack_380 = std::vector<gdsAREF,_std::allocator<gdsAREF>_>::end(&pvVar8->AREF);
    bVar2 = __gnu_cxx::operator!=(&local_378,&stack0xfffffffffffffc80);
    if (!bVar2) {
LAB_0012a5c6:
      *destination = local_38;
      destination[1] = iStack_34;
      destination[2] = bound_box[0];
      destination[3] = bound_box[1];
      return 0;
    }
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    pmVar15 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[](&this->STR_Lookup,&pgVar14->name);
    iVar3 = *pmVar15;
    if (iVar3 == 1000000000) {
      poVar16 = std::operator<<((ostream *)&std::cout,"Error: reference to structure with no name.")
      ;
      std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
      poVar16 = std::operator<<((ostream *)&std::cout,"Terminating AREF bounding box check.");
      std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
      goto LAB_0012a5c6;
    }
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)iVar3);
    iVar4 = pvVar8->bounding_box[0];
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)iVar3);
    iVar5 = pvVar8->bounding_box[1];
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)iVar3);
    iVar6 = pvVar8->bounding_box[2];
    pvVar8 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::operator[](&this->STR,(long)iVar3);
    iVar3 = pvVar8->bounding_box[3];
    if ((((iVar4 == 0) && (iVar5 == 0)) && (iVar6 == 0)) && (iVar3 == 0)) {
      poVar16 = std::operator<<((ostream *)&std::cout,
                                "Warning: Structure being referenced for AREF does not have an initialized"
                               );
      std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
      poVar16 = std::operator<<((ostream *)&std::cout,
                                "bounding box. Therefore, bounding boxes of references will be inaccurate."
                               );
      std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
      poVar16 = std::operator<<((ostream *)&std::cout,
                                "Calculate bounding boxes from the lowest level (unreferenced) upwards."
                               );
      std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
    }
    POINT::POINT((POINT *)&corRow.y);
    POINT::POINT((POINT *)&corCol.y);
    POINT::POINT((POINT *)&true_max.y);
    POINT::POINT((POINT *)&enclosed_array[3].y);
    local_520 = (POINT *)&referred_structure_width;
    do {
      POINT::POINT(local_520);
      local_520 = local_520 + 1;
    } while (local_520 != (POINT *)&enclosed_array[3].y);
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    iVar7 = (int)pgVar14->angle;
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    corRow.y = (double)pgVar14->xCor;
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    dVar18 = (double)pgVar14->yCor;
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    corCol.y = (double)pgVar14->xCorRow;
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    corRow.x = (double)pgVar14->yCorRow;
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    true_max.y = (double)pgVar14->xCorCol;
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    corCol.x = (double)pgVar14->yCorCol;
    rotate_point(corRow.y,dVar18,(double)-iVar7,(POINT *)&corCol.y);
    rotate_point(corRow.y,dVar18,(double)-iVar7,(POINT *)&true_max.y);
    dVar19 = corCol.y - corRow.y;
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    iVar1 = pgVar14->colCnt;
    dVar20 = corCol.x - dVar18;
    pgVar14 = __gnu_cxx::
              __normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
              operator->(&local_378);
    enclosed_array[0].y = (corCol.y - dVar19 / (double)iVar1) + (double)(iVar6 - iVar4);
    enclosed_array[2].x = (corCol.x - dVar20 / (double)pgVar14->rowCnt) + (double)(iVar3 - iVar5);
    _referred_structure_width = corRow.y;
    enclosed_array[2].y = corRow.y;
    enclosed_array[0].x = dVar18;
    enclosed_array[1].x = dVar18;
    enclosed_array[1].y = enclosed_array[0].y;
    enclosed_array[3].x = enclosed_array[2].x;
    enclosed_array[3].y = enclosed_array[0].y;
    true_max.x = enclosed_array[2].x;
    rotate_point(corRow.y,dVar18,(double)iVar7,(POINT *)&referred_structure_width);
    rotate_point(corRow.y,dVar18,(double)iVar7,(POINT *)&enclosed_array[0].y);
    rotate_point(corRow.y,dVar18,(double)iVar7,(POINT *)&enclosed_array[1].y);
    rotate_point(corRow.y,dVar18,(double)iVar7,(POINT *)&enclosed_array[2].y);
    x_max = (int)_referred_structure_width;
    if (enclosed_array[0].y < (double)x_max) {
      x_max = (int)enclosed_array[0].y;
    }
    if (enclosed_array[1].y < (double)x_max) {
      x_max = (int)enclosed_array[1].y;
    }
    if (enclosed_array[2].y < (double)x_max) {
      x_max = (int)enclosed_array[2].y;
    }
    local_444 = (int)_referred_structure_width;
    if ((double)local_444 < enclosed_array[0].y) {
      local_444 = (int)enclosed_array[0].y;
    }
    if ((double)local_444 < enclosed_array[1].y) {
      local_444 = (int)enclosed_array[1].y;
    }
    if ((double)local_444 < enclosed_array[2].y) {
      x_max = (int)enclosed_array[2].y;
    }
    y_max = (int)enclosed_array[0].x;
    if (enclosed_array[1].x < (double)y_max) {
      y_max = (int)enclosed_array[1].x;
    }
    if (enclosed_array[2].x < (double)y_max) {
      y_max = (int)enclosed_array[2].x;
    }
    if (enclosed_array[3].x < (double)y_max) {
      y_max = (int)enclosed_array[3].x;
    }
    local_448 = (int)enclosed_array[0].x;
    if ((double)local_448 < enclosed_array[1].x) {
      local_448 = (int)enclosed_array[1].x;
    }
    if ((double)local_448 < enclosed_array[2].x) {
      local_448 = (int)enclosed_array[2].x;
    }
    if ((double)local_448 < enclosed_array[3].x) {
      local_448 = (int)enclosed_array[3].x;
    }
    if ((boundary_iterator._M_current._7_1_ & 1) == 0) {
      local_38 = x_max;
      iStack_34 = y_max;
      bound_box[0] = local_444;
      bound_box[1] = local_448;
      boundary_iterator._M_current._7_1_ = 1;
    }
    if (x_max < local_38) {
      local_38 = x_max;
    }
    if (bound_box[0] < local_444) {
      bound_box[0] = local_444;
    }
    if (y_max < iStack_34) {
      iStack_34 = y_max;
    }
    if (bound_box[1] < local_448) {
      bound_box[1] = local_448;
    }
    __gnu_cxx::__normal_iterator<gdsAREF_*,_std::vector<gdsAREF,_std::allocator<gdsAREF>_>_>::
    operator++(&local_378,0);
  } while( true );
}

Assistant:

int gdscpp::calculate_STR_bounding_box(int structure_index, int *destination)
{
  int bound_box[4]; // xmin, ymin, xmax, ymax of structure
  bool box_initialized = false;
  // ======================= Look through boundaries =======================
  auto boundary_iterator = STR[structure_index].BOUNDARY.begin();
  while (boundary_iterator != STR[structure_index].BOUNDARY.end()) {
    int STR_bound_box[4];
    if (box_initialized == false) {
      // Initialize bounding box
      fetch_boundary_bounding_box(*boundary_iterator, bound_box);
      box_initialized = true;
    } else {
      // Compare for minimum/maximums
      fetch_boundary_bounding_box(*boundary_iterator, STR_bound_box);
      if (STR_bound_box[0] < bound_box[0])
        bound_box[0] = STR_bound_box[0];
      if (STR_bound_box[1] < bound_box[1])
        bound_box[1] = STR_bound_box[1];
      if (STR_bound_box[2] > bound_box[2])
        bound_box[2] = STR_bound_box[2];
      if (STR_bound_box[3] > bound_box[3])
        bound_box[3] = STR_bound_box[3];
    }
    boundary_iterator++;
  }
  // ========================= Look through boxes ==========================
  auto box_iter = STR[structure_index].BOX.begin();
  while (box_iter != STR[structure_index].BOX.end()) {
    int BOX_bound_box[4];
    if (box_initialized == false) {
      fetch_box_bounding_box(*box_iter, bound_box);
      box_initialized = true;
    } else {
      fetch_box_bounding_box(*box_iter, BOX_bound_box);
      if (BOX_bound_box[0] < bound_box[0])
        bound_box[0] = BOX_bound_box[0];
      if (BOX_bound_box[1] < bound_box[1])
        bound_box[1] = BOX_bound_box[1];
      if (BOX_bound_box[2] > bound_box[2])
        bound_box[2] = BOX_bound_box[2];
      if (BOX_bound_box[3] > bound_box[3])
        bound_box[3] = BOX_bound_box[3];
    }
    box_iter++;
  }
  // ========================= Look through paths ==========================
  auto path_iter = STR[structure_index].PATH.begin();
  while (path_iter != STR[structure_index].PATH.end()) {
    // Neglect path type. Simplify work by assuming max half-width protrusion.
    // Worst case scenario is that the bounding box is ever so slightly
    // bigger than actually needed for a flat-cap situation.
    int offset = (int)(round(((double)path_iter->width * 0.5)));
    int local_bbox[4] = {
        (*min_element(path_iter->xCor.begin(), path_iter->xCor.end()) - offset),
        (*min_element(path_iter->yCor.begin(), path_iter->yCor.end()) - offset),
        (*max_element(path_iter->xCor.begin(), path_iter->xCor.end()) + offset),
        (*max_element(path_iter->yCor.begin(), path_iter->yCor.end()) +
         offset)};
    if (box_initialized == false) {
      bound_box[0] = local_bbox[0];
      bound_box[1] = local_bbox[1];
      bound_box[2] = local_bbox[2];
      bound_box[3] = local_bbox[3];
      box_initialized = true;
    }
    if (local_bbox[0] < bound_box[0])
      bound_box[0] = local_bbox[0]; // new minimum
    if (local_bbox[2] > bound_box[2])
      bound_box[2] = local_bbox[2]; // new maximum
    if (local_bbox[1] < bound_box[1])
      bound_box[1] = local_bbox[1];
    if (local_bbox[3] > bound_box[3])
      bound_box[3] = local_bbox[3];
    path_iter++;
  }
  // ================== Look through structure references ==================
  auto SREF_iter = STR[structure_index].SREF.begin();
  while (SREF_iter != STR[structure_index].SREF.end()) {
    // Warn user if specified structure's bounding box is not yet initialized
    int target_structure_index = STR_Lookup[SREF_iter->name];
    if (target_structure_index == 1000000000) {
      cout << "Error: reference to structure with no name." << endl;
      cout << "Terminating SREF bounding box check." << endl;
      break;
    }
    int referred_bound_box[4];
    referred_bound_box[0] = STR[target_structure_index].bounding_box[0];
    referred_bound_box[1] = STR[target_structure_index].bounding_box[1];
    referred_bound_box[2] = STR[target_structure_index].bounding_box[2];
    referred_bound_box[3] = STR[target_structure_index].bounding_box[3];

    if ((referred_bound_box[0] == 0) && (referred_bound_box[1] == 0) &&
        (referred_bound_box[2] == 0) && (referred_bound_box[3] == 0)) {
      // cout << "Warning: Structure being referenced does not have an
      // initialized"
      //      << endl;
      // cout << "bounding box. Therefore, bounding boxes of references will be
      // "
      //         "inaccurate."
      //      << endl;
      // cout << "Calculate bounding boxes from the lowest level (unreferenced)
      // "
      //         "upwards."
      //      << endl;
      cout << "Warning: Inaccuracy due to structures not being initialized."
           << endl;
    }
    if (SREF_iter->reflection == true) // Reflect about x-axis
    {
      // Reflect the box about x-axis and swap because max becomes min
      int placeholder = referred_bound_box[1];
      referred_bound_box[1] = -1 * referred_bound_box[3];
      referred_bound_box[3] = -1 * placeholder;
    }
    double x_1 = referred_bound_box[0];
    double y_1 = referred_bound_box[1];
    double x_2 = referred_bound_box[2];
    double y_2 = referred_bound_box[3];
    if (SREF_iter->scale != 1) // Multiply by scale factor
    {
      x_1 = x_1 * SREF_iter->scale;
      x_2 = x_2 * SREF_iter->scale;
      y_1 = y_1 * SREF_iter->scale;
      y_2 = y_2 * SREF_iter->scale;
    }
    // Rotate
    int angle = SREF_iter->angle;
    if (angle > 0) {
      while (angle >= 360) {
        angle = angle - 360;
      }
      double x_1_new = x_1 * cos(angle * 3.141592653589 / 180) -
                       y_1 * sin(angle * 3.141592653589 / 180);
      double y_1_new = x_1 * sin(angle * 3.141592653589 / 180) +
                       y_1 * cos(angle * 3.141592653589 / 180);
      double x_2_new = x_2 * cos(angle * 3.141592653589 / 180) -
                       y_2 * sin(angle * 3.141592653589 / 180);
      double y_2_new = x_2 * sin(angle * 3.141592653589 / 180) +
                       y_2 * cos(angle * 3.141592653589 / 180);
      x_1 = x_1_new;
      y_1 = y_1_new;
      x_2 = x_2_new;
      y_2 = y_2_new;
      // convert back to vertical box by getting the new minimum and maximum
      if (x_1 > x_2) {
        double temp_holder = x_2;
        x_2 = x_1;
        x_1 = temp_holder;
      }
      if (y_1 > y_2) {
        double temp_holder2 = y_2;
        y_2 = y_1;
        y_1 = temp_holder2;
      }
    }
    // Offset shape according to translation
    referred_bound_box[0] = (int)(round(x_1)) + SREF_iter->xCor;
    referred_bound_box[1] = (int)(round(y_1)) + SREF_iter->yCor;
    referred_bound_box[2] = (int)(round(x_2)) + SREF_iter->xCor;
    referred_bound_box[3] = (int)(round(y_2)) + SREF_iter->yCor;

    if (box_initialized == false) {
      bound_box[0] = referred_bound_box[0];
      bound_box[1] = referred_bound_box[1];
      bound_box[2] = referred_bound_box[2];
      bound_box[3] = referred_bound_box[3];
      box_initialized = true;
    }
    // See if min, max x,y becomes the structures min, max x,y
    if (referred_bound_box[0] < bound_box[0])
      bound_box[0] = referred_bound_box[0]; // new minimum
    if (referred_bound_box[2] > bound_box[2])
      bound_box[2] = referred_bound_box[2]; // new maximum
    if (referred_bound_box[1] < bound_box[1])
      bound_box[1] = referred_bound_box[1];
    if (referred_bound_box[3] > bound_box[3])
      bound_box[3] = referred_bound_box[3];

    SREF_iter++;
  }
  // ==================== Look through array references ====================
  auto AREF_iter = STR[structure_index].AREF.begin();
  while (AREF_iter != STR[structure_index].AREF.end()) {
    // Warn user if specified structure's bounding box is not yet initialized
    int target_structure_index = STR_Lookup[AREF_iter->name];
    if (target_structure_index == 1000000000) {
      cout << "Error: reference to structure with no name." << endl;
      cout << "Terminating AREF bounding box check." << endl;
      break;
    }
    // fetch bounding box of the array reference structure
    int a_referred_bound_box[4] = {STR[target_structure_index].bounding_box[0],
                                   STR[target_structure_index].bounding_box[1],
                                   STR[target_structure_index].bounding_box[2],
                                   STR[target_structure_index].bounding_box[3]};
    if ((a_referred_bound_box[0] == 0) && (a_referred_bound_box[1] == 0) &&
        (a_referred_bound_box[2] == 0) && (a_referred_bound_box[3] == 0)) {
      cout << "Warning: Structure being referenced for AREF does not have an "
              "initialized"
           << endl;
      cout << "bounding box. Therefore, bounding boxes of references will be "
              "inaccurate."
           << endl;
      cout << "Calculate bounding boxes from the lowest level (unreferenced) "
              "upwards."
           << endl;
    }
    // Rotate array reference back to original dimensions
    POINT cor, corRow, corCol, true_max;
    POINT enclosed_array[4];
    int aref_angle = AREF_iter->angle;
    cor.x = (double)AREF_iter->xCor;
    cor.y = (double)AREF_iter->yCor;
    corRow.x = (double)AREF_iter->xCorRow;
    corRow.y = (double)AREF_iter->yCorRow;
    corCol.x = (double)AREF_iter->xCorCol;
    corCol.y = (double)AREF_iter->yCorCol;
    rotate_point(cor.x, cor.y, (-aref_angle), corRow);
    rotate_point(cor.x, cor.y, (-aref_angle), corCol);
    // Determine the true endpoints (without blank space at end)
    int referred_structure_width =
        a_referred_bound_box[2] - a_referred_bound_box[0];
    int referred_structure_height =
        a_referred_bound_box[3] - a_referred_bound_box[1];
    double column_spacing = (corRow.x - cor.x) / AREF_iter->colCnt;
    double row_spacing = (corCol.y - cor.y) / AREF_iter->rowCnt;
    true_max.x = corRow.x - column_spacing + referred_structure_width;
    true_max.y = corCol.y - row_spacing + referred_structure_height;
    enclosed_array[0].x = cor.x;
    enclosed_array[0].y = cor.y;
    enclosed_array[1].x = true_max.x;
    enclosed_array[1].y = cor.y;
    enclosed_array[2].x = true_max.x;
    enclosed_array[2].y = true_max.y;
    enclosed_array[3].x = cor.x;
    enclosed_array[3].y = true_max.y;
    // Rotate the 4 points of the box to their correct positions
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[0]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[1]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[2]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[3]);
    // Determine min/maxes for new box
    int x_min, y_min, x_max, y_max;
    x_min = (int)enclosed_array[0].x;
    if (enclosed_array[1].x < (double)x_min)
      x_min = (int)enclosed_array[1].x;
    if (enclosed_array[2].x < (double)x_min)
      x_min = (int)enclosed_array[2].x;
    if (enclosed_array[3].x < (double)x_min)
      x_min = (int)enclosed_array[3].x;

    x_max = (int)enclosed_array[0].x;
    if (enclosed_array[1].x > (double)x_max)
      x_max = (int)enclosed_array[1].x;
    if (enclosed_array[2].x > (double)x_max)
      x_max = (int)enclosed_array[2].x;
    if (enclosed_array[3].x > (double)x_max)
      x_min = (int)enclosed_array[3].x;

    y_min = (int)enclosed_array[0].y;
    if (enclosed_array[1].y < (double)y_min)
      y_min = (int)enclosed_array[1].y;
    if (enclosed_array[2].y < (double)y_min)
      y_min = (int)enclosed_array[2].y;
    if (enclosed_array[3].y < (double)y_min)
      y_min = (int)enclosed_array[3].y;

    y_max = (int)enclosed_array[0].y;
    if (enclosed_array[1].y > (double)y_max)
      y_max = (int)enclosed_array[1].y;
    if (enclosed_array[2].y > (double)y_max)
      y_max = (int)enclosed_array[2].y;
    if (enclosed_array[3].y > (double)y_max)
      y_max = (int)enclosed_array[3].y;

    // Do the comparison against the structure bounding box
    if (box_initialized == false) {
      bound_box[0] = x_min;
      bound_box[1] = y_min;
      bound_box[2] = x_max;
      bound_box[3] = y_max;
      box_initialized = true;
    }
    // See if min, max x,y becomes the structures min, max x,y
    if (x_min < bound_box[0])
      bound_box[0] = x_min; // new minimum
    if (x_max > bound_box[2])
      bound_box[2] = x_max; // new maximum
    if (y_min < bound_box[1])
      bound_box[1] = y_min;
    if (y_max > bound_box[3])
      bound_box[3] = y_max;
    AREF_iter++;
  }
  // =============== Send the bounding box to specified array ==============
  destination[0] = bound_box[0];
  destination[1] = bound_box[1];
  destination[2] = bound_box[2];
  destination[3] = bound_box[3];
  return EXIT_SUCCESS;
}